

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_changed_ranges.c
# Opt level: O0

_Bool ts_range_array_intersects
                (TSRangeArray *self,uint start_index,uint32_t start_byte,uint32_t end_byte)

{
  TSRange *range;
  uint i;
  uint32_t end_byte_local;
  uint32_t start_byte_local;
  uint start_index_local;
  TSRangeArray *self_local;
  
  range._0_4_ = start_index;
  while( true ) {
    if (self->size <= (uint)range) {
      return false;
    }
    if (start_byte < self->contents[(uint)range].end_byte) break;
    range._0_4_ = (uint)range + 1;
  }
  if (end_byte <= self->contents[(uint)range].start_byte) {
    return false;
  }
  return true;
}

Assistant:

bool ts_range_array_intersects(const TSRangeArray *self, unsigned start_index,
                               uint32_t start_byte, uint32_t end_byte) {
  for (unsigned i = start_index; i < self->size; i++) {
    TSRange *range = &self->contents[i];
    if (range->end_byte > start_byte) {
      if (range->start_byte >= end_byte) break;
      return true;
    }
  }
  return false;
}